

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O1

int read_quoted(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  
  iVar1 = fgetc((FILE *)fin);
  if (iVar1 < 0x66) {
    if (iVar1 == 10) {
      lineno = lineno + 1;
      return -1;
    }
    if (iVar1 == 0x61) {
      return 7;
    }
    if (iVar1 == 0x62) {
      return 8;
    }
    goto switchD_001982c8_caseD_6f;
  }
  switch(iVar1) {
  case 0x6e:
    iVar1 = 10;
    break;
  case 0x72:
    iVar1 = 0xd;
    break;
  case 0x74:
    iVar1 = 9;
    break;
  case 0x76:
    iVar1 = 0xb;
    break;
  case 0x78:
    iVar1 = 0;
    iVar4 = 2;
    do {
      iVar2 = fgetc((FILE *)fin);
      iVar3 = hexdigit(iVar2);
      if (iVar3 < 0x10) {
        iVar1 = iVar1 * 0x10 + iVar3;
      }
      else {
        ungetc(iVar2,(FILE *)fin);
      }
      bVar5 = iVar4 != 0;
      iVar4 = iVar4 + -1;
    } while ((iVar3 < 0x10) && (bVar5));
    break;
  default:
    if (iVar1 == 0x66) {
      return 0xc;
    }
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x75:
  case 0x77:
switchD_001982c8_caseD_6f:
    if (0xfffffff7 < iVar1 - 0x38U) {
      iVar1 = iVar1 + -0x30;
      iVar4 = 0;
      do {
        iVar2 = fgetc((FILE *)fin);
        iVar3 = hexdigit(iVar2);
        if (iVar3 < 8) {
          iVar1 = iVar3 + iVar1 * 8;
        }
        else {
          ungetc(iVar2,(FILE *)fin);
        }
        bVar5 = iVar4 == 0;
        iVar4 = iVar4 + -1;
      } while ((iVar3 < 8) && (bVar5));
    }
  }
  return iVar1;
}

Assistant:

static int read_quoted() {	// read whatever character is after a \ .
  int c,d,x;
  switch(c = fgetc(fin)) {
  case '\n': lineno++; return -1;
  case 'a' : return('\a');
  case 'b' : return('\b');
  case 'f' : return('\f');
  case 'n' : return('\n');
  case 'r' : return('\r');
  case 't' : return('\t');
  case 'v' : return('\v');
  case 'x' :	/* read hex */
    for (c=x=0; x<3; x++) {
      int ch = fgetc(fin);
      d = hexdigit(ch);
      if (d > 15) {ungetc(ch,fin); break;}
      c = (c<<4)+d;
    }
    break;
  default:		/* read octal */
    if (c<'0' || c>'7') break;
    c -= '0';
    for (x=0; x<2; x++) {
      int ch = fgetc(fin);
      d = hexdigit(ch);
      if (d>7) {ungetc(ch,fin); break;}
      c = (c<<3)+d;
    }
    break;
  }
  return(c);
}